

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addMethod(QMetaObjectBuilder *this,QByteArray *signature,QByteArray *returnType)

{
  size_type sVar1;
  vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *pvVar2;
  int index_00;
  QMetaObjectBuilder *in_RDI;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar3;
  int index;
  value_type *in_stack_ffffffffffffff18;
  QMetaMethodBuilderPrivate *in_stack_ffffffffffffff20;
  QByteArray *in_stack_ffffffffffffff50;
  MethodType in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  QByteArray local_80 [4];
  QMetaMethodBuilder local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::size
                    (&in_RDI->d->methods);
  index_00 = (int)sVar1;
  pvVar2 = &in_RDI->d->methods;
  QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate
            ((QMetaMethodBuilderPrivate *)CONCAT44(index_00,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,local_80,
             (Access)((ulong)pvVar2 >> 0x20),(int)pvVar2);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::push_back
            ((vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *)
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  QMetaMethodBuilderPrivate::~QMetaMethodBuilderPrivate(in_stack_ffffffffffffff20);
  QMetaMethodBuilder::QMetaMethodBuilder(&local_18,in_RDI,index_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar3._index = local_18._index;
    QVar3._mobj = local_18._mobj;
    QVar3._12_4_ = 0;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addMethod(const QByteArray &signature,
                                                 const QByteArray &returnType)
{
    int index = int(d->methods.size());
    d->methods.push_back(QMetaMethodBuilderPrivate(QMetaMethod::Method, signature, returnType));
    return QMetaMethodBuilder(this, index);
}